

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall Rml::Element::Matches(Element *this,String *selectors)

{
  pointer *this_00;
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  reference ppSVar4;
  StyleSheetNode *node;
  iterator __end1;
  iterator __begin1;
  StyleSheetNodeListRaw *__range1;
  String local_168;
  undefined1 local_138 [8];
  StyleSheetNodeListRaw leaf_nodes;
  StyleSheetNode root_node;
  String *selectors_local;
  Element *this_local;
  
  this_00 = &leaf_nodes.
             super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  StyleSheetNode::StyleSheetNode((StyleSheetNode *)this_00);
  StyleSheetParser::ConstructNodes
            ((StyleSheetNodeListRaw *)local_138,(StyleSheetNode *)this_00,selectors);
  bVar1 = ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::empty
                    ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)
                     local_138);
  if (bVar1) {
    uVar2 = ::std::__cxx11::string::c_str();
    GetAddress_abi_cxx11_(&local_168,this,false,true);
    uVar3 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"Query selector \'%s\' is empty. In element %s",uVar2,uVar3);
    ::std::__cxx11::string::~string((string *)&local_168);
    this_local._7_1_ = false;
  }
  else {
    __end1 = ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::begin
                       ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)
                        local_138);
    node = (StyleSheetNode *)
           ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::end
                     ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)
                      local_138);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<Rml::StyleSheetNode_**,_std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>_>
                                  *)&node);
      if (!bVar1) break;
      ppSVar4 = __gnu_cxx::
                __normal_iterator<Rml::StyleSheetNode_**,_std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>_>
                ::operator*(&__end1);
      bVar1 = StyleSheetNode::IsApplicable(*ppSVar4,this,this);
      if (bVar1) {
        this_local._7_1_ = true;
        goto LAB_00550d31;
      }
      __gnu_cxx::
      __normal_iterator<Rml::StyleSheetNode_**,_std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = false;
  }
LAB_00550d31:
  ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::~vector
            ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)local_138);
  StyleSheetNode::~StyleSheetNode
            ((StyleSheetNode *)
             &leaf_nodes.
              super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool Element::Matches(const String& selectors)
{
	StyleSheetNode root_node;
	StyleSheetNodeListRaw leaf_nodes = StyleSheetParser::ConstructNodes(root_node, selectors);

	if (leaf_nodes.empty())
	{
		Log::Message(Log::LT_WARNING, "Query selector '%s' is empty. In element %s", selectors.c_str(), GetAddress().c_str());
		return false;
	}

	for (const StyleSheetNode* node : leaf_nodes)
	{
		if (node->IsApplicable(this, this))
		{
			return true;
		}
	}

	return false;
}